

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.cpp
# Opt level: O0

InfoStatus
getLocalInfoValue(HighsLogOptions *report_log_options,string *name,bool valid,
                 vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *info_records,double *value)

{
  const_reference ppIVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *in_RCX;
  byte in_DL;
  HighsLogOptions *in_RDI;
  undefined8 *in_R8;
  InfoRecordDouble info;
  HighsInfoType type;
  InfoStatus status;
  HighsInt index;
  InfoRecordDouble *in_stack_ffffffffffffff08;
  InfoRecordDouble *in_stack_ffffffffffffff10;
  vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  HighsLogOptions *in_stack_ffffffffffffff28;
  HighsInfoType in_stack_ffffffffffffff3c;
  undefined8 *local_80;
  string local_60 [36];
  HighsInfoType local_3c;
  InfoStatus local_38;
  int local_34;
  undefined8 *local_30;
  vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *local_28;
  byte local_19;
  HighsLogOptions *local_10;
  InfoStatus local_4;
  
  local_19 = in_DL & 1;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_10 = in_RDI;
  local_38 = getInfoIndex(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                          in_stack_ffffffffffffff18,(HighsInt *)in_stack_ffffffffffffff10);
  local_4 = local_38;
  if (local_38 == kOk) {
    if ((local_19 & 1) == 0) {
      local_4 = kUnavailable;
    }
    else {
      ppIVar1 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                          (local_28,(long)local_34);
      local_3c = (*ppIVar1)->type;
      if (local_3c == kDouble) {
        std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                  (local_28,(long)local_34);
        InfoRecordDouble::InfoRecordDouble(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        *local_30 = *local_80;
        local_4 = kOk;
        InfoRecordDouble::~InfoRecordDouble((InfoRecordDouble *)0x4d2872);
      }
      else {
        uVar2 = std::__cxx11::string::c_str();
        infoEntryTypeToString_abi_cxx11_(in_stack_ffffffffffffff3c);
        uVar3 = std::__cxx11::string::c_str();
        highsLogUser(local_10,kError,
                     "getInfoValue: Info \"%s\" requires value of type %s, not double\n",uVar2,uVar3
                    );
        std::__cxx11::string::~string(local_60);
        local_4 = kIllegalValue;
      }
    }
  }
  return local_4;
}

Assistant:

InfoStatus getLocalInfoValue(const HighsLogOptions& report_log_options,
                             const std::string& name, const bool valid,
                             const std::vector<InfoRecord*>& info_records,
                             double& value) {
  HighsInt index;
  InfoStatus status =
      getInfoIndex(report_log_options, name, info_records, index);
  if (status != InfoStatus::kOk) return status;
  if (!valid) return InfoStatus::kUnavailable;
  HighsInfoType type = info_records[index]->type;
  if (type != HighsInfoType::kDouble) {
    highsLogUser(
        report_log_options, HighsLogType::kError,
        "getInfoValue: Info \"%s\" requires value of type %s, not double\n",
        name.c_str(), infoEntryTypeToString(type).c_str());
    return InfoStatus::kIllegalValue;
  }
  InfoRecordDouble info = ((InfoRecordDouble*)info_records[index])[0];
  value = *info.value;
  return InfoStatus::kOk;
}